

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

iterator __thiscall
QList<QGraphicsItemAnimationPrivate::Pair>::begin(QList<QGraphicsItemAnimationPrivate::Pair> *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,(QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *)0x0);
  }
  return (iterator)(this->d).ptr;
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }